

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P33x.h
# Opt level: O3

int ReadChannelP33x(P33X *pP33x,uint8 Channel,float *pValue)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ssize_t sVar4;
  uchar m;
  char cVar5;
  long lVar6;
  char cVar7;
  uint uVar8;
  char *__s;
  ulong uVar9;
  uint8 writebuf [5];
  uint8 readbuf [9];
  byte local_2e [2];
  uint8 local_2c;
  ushort local_2b;
  byte local_29 [2];
  uint local_27;
  char local_22;
  char local_21;
  
  local_2e[0] = 0xfa;
  local_2e[1] = 0x49;
  local_2c = Channel;
  uVar3 = 0xffff;
  cVar5 = '\x03';
  lVar6 = 0;
  do {
    uVar3 = uVar3 ^ local_2e[lVar6];
    cVar7 = '\b';
    do {
      uVar8 = uVar3 >> 1;
      uVar2 = uVar3 & 1;
      uVar3 = uVar8 ^ 0xa001;
      if (uVar2 == 0) {
        uVar3 = uVar8;
      }
      cVar7 = cVar7 + -1;
    } while (cVar7 != '\0');
    lVar6 = lVar6 + 1;
    cVar5 = cVar5 + -1;
  } while (cVar5 != '\0');
  local_2b = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
  iVar1 = (pP33x->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pP33x->RS232Port).s;
    uVar9 = 0;
    do {
      sVar4 = send(iVar1,local_2e + uVar9,(ulong)(5 - (int)uVar9),0);
      if ((int)sVar4 < 1) goto LAB_001284a8;
      uVar3 = (int)uVar9 + (int)sVar4;
      uVar9 = (ulong)uVar3;
    } while ((int)uVar3 < 5);
  }
  else {
    if (iVar1 != 0) {
LAB_001284a8:
      __s = "Error writing data to a P33x. ";
      goto LAB_001285ce;
    }
    iVar1 = *(int *)&(pP33x->RS232Port).hDev;
    uVar9 = 0;
    do {
      sVar4 = write(iVar1,local_2e + uVar9,(ulong)(5 - (int)uVar9));
      if ((int)sVar4 < 1) goto LAB_001284a8;
      uVar3 = (int)uVar9 + (int)sVar4;
      uVar9 = (ulong)uVar3;
    } while (uVar3 < 5);
  }
  iVar1 = (pP33x->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pP33x->RS232Port).s;
    uVar9 = 0;
    do {
      sVar4 = recv(iVar1,local_29 + uVar9,(ulong)(5 - (int)uVar9),0);
      if ((int)sVar4 < 1) goto LAB_001285c7;
      uVar3 = (int)uVar9 + (int)sVar4;
      uVar9 = (ulong)uVar3;
    } while ((int)uVar3 < 5);
LAB_001284ed:
    iVar1 = (pP33x->RS232Port).DevType;
    if (iVar1 - 1U < 4) {
      iVar1 = (pP33x->RS232Port).s;
      uVar9 = 0;
      do {
        sVar4 = recv(iVar1,local_29 + uVar9,(ulong)(9 - (int)uVar9),0);
        if ((int)sVar4 < 1) goto LAB_001285c7;
        uVar3 = (int)uVar9 + (int)sVar4;
        uVar9 = (ulong)uVar3;
      } while ((int)uVar3 < 9);
    }
    else {
      if (iVar1 != 0) goto LAB_001285c7;
      iVar1 = *(int *)&(pP33x->RS232Port).hDev;
      uVar9 = 0;
      do {
        sVar4 = read(iVar1,local_29 + uVar9,(ulong)(9 - (int)uVar9));
        if ((int)sVar4 < 1) goto LAB_001285c7;
        uVar3 = (int)uVar9 + (int)sVar4;
        uVar9 = (ulong)uVar3;
      } while (uVar3 < 9);
    }
    if (local_29[0] == 0xfa) {
      if (local_29[1] == 'I') {
        uVar3 = 0xffff;
        cVar5 = '\a';
        lVar6 = 0;
        do {
          uVar3 = uVar3 ^ local_29[lVar6];
          cVar7 = '\b';
          do {
            uVar8 = uVar3 >> 1;
            uVar2 = uVar3 & 1;
            uVar3 = uVar8 ^ 0xa001;
            if (uVar2 == 0) {
              uVar3 = uVar8;
            }
            cVar7 = cVar7 + -1;
          } while (cVar7 != '\0');
          lVar6 = lVar6 + 1;
          cVar5 = cVar5 + -1;
        } while (cVar5 != '\0');
        if ((local_22 == (char)(uVar3 >> 8)) && (local_21 == (char)uVar3)) {
          *pValue = (float)(local_27 >> 0x18 | (local_27 & 0xff0000) >> 8 | (local_27 & 0xff00) << 8
                           | local_27 << 0x18);
          return 0;
        }
        __s = "Error reading data from a P33x : Bad CRC-16. ";
      }
      else {
        __s = "Error reading data from a P33x : The device function failed. ";
      }
    }
    else {
      __s = "Error reading data from a P33x : Bad device address. ";
    }
  }
  else {
    if (iVar1 == 0) {
      iVar1 = *(int *)&(pP33x->RS232Port).hDev;
      uVar9 = 0;
      do {
        sVar4 = read(iVar1,local_29 + uVar9,(ulong)(5 - (int)uVar9));
        if ((int)sVar4 < 1) goto LAB_001285c7;
        uVar3 = (int)uVar9 + (int)sVar4;
        uVar9 = (ulong)uVar3;
      } while (uVar3 < 5);
      goto LAB_001284ed;
    }
LAB_001285c7:
    __s = "Error reading data from a P33x. ";
  }
LAB_001285ce:
  puts(__s);
  return 1;
}

Assistant:

inline int ReadChannelP33x(P33X* pP33x, uint8 Channel, float* pValue)
{
	uint8 readbuf[9];
	uint8 writebuf[5];
	uint8 crc_h = 0;
	uint8 crc_l = 0;
	uFloat_P33X value;
	//int stat = 0;

	writebuf[0] = (uint8)0xfa; // device address = 250
	writebuf[1] = (uint8)0x49; // function 73
	writebuf[2] = (uint8)Channel; // Channel to read
	CalcCRC16(writebuf, 5-2, &(writebuf[3]), &(writebuf[4])); // CRC-16

	if (WriteAllRS232Port(&pP33x->RS232Port, writebuf, 5) != EXIT_SUCCESS)
	{ 
		printf("Error writing data to a P33x. \n");
		return EXIT_FAILURE;
	}

	// Read the echo.
	if (ReadAllRS232Port(&pP33x->RS232Port, readbuf, 5) != EXIT_SUCCESS)
	{
		printf("Error reading data from a P33x. \n");
		return EXIT_FAILURE;
	}

	// Read the data.
	if (ReadAllRS232Port(&pP33x->RS232Port, readbuf, 9) != EXIT_SUCCESS)
	{
		printf("Error reading data from a P33x. \n");
		return EXIT_FAILURE;
	}

	// Device address = 250.
	if (readbuf[0] != (uint8)0xfa)
	{ 
		printf("Error reading data from a P33x : Bad device address. \n");
		return EXIT_FAILURE;	
	}

	// Function 73.
	if (readbuf[1] != (uint8)0x49)
	{
		printf("Error reading data from a P33x : The device function failed. \n");
		return EXIT_FAILURE;	
	}

	CalcCRC16(readbuf, 9-2, &crc_h, &crc_l);

	// CRC-16.
	if ((readbuf[7] != crc_h)||(readbuf[8] != crc_l))
	{ 
		printf("Error reading data from a P33x : Bad CRC-16. \n");
		return EXIT_FAILURE;	
	}

	value.c[3] = readbuf[2];
	value.c[2] = readbuf[3];
	value.c[1] = readbuf[4];
	value.c[0] = readbuf[5];
	//stat = readbuf[6];

	*pValue = value.v;

	//PRINT_DEBUG_MESSAGE_OSUTILS(("Channel value : %f\n", (double)*pValue));
	//PRINT_DEBUG_MESSAGE_OSUTILS(("Status information : %d\n", stat));

	return EXIT_SUCCESS;
}